

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_ssse3_intr.c
# Opt level: O3

void ihevc_intra_pred_luma_dc_ssse3
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  ulong uVar1;
  bool bVar2;
  UWORD8 aUVar3 [16];
  bool bVar4;
  uint uVar5;
  long lVar6;
  byte bVar7;
  UWORD8 *pUVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  undefined1 in_XMM0 [16];
  undefined1 auVar13 [16];
  short sVar14;
  short sVar16;
  undefined8 uVar15;
  ushort uVar17;
  undefined4 uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  undefined1 in_XMM2 [16];
  ushort uVar25;
  ushort uVar26;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  undefined1 in_XMM3 [16];
  undefined1 auVar27 [16];
  ushort uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  
  aUVar3 = IHEVCE_SHUFFLEMASK4;
  uVar5 = nt << 0x1e | nt - 4U >> 2;
  bVar7 = 6;
  if (uVar5 < 4) {
    bVar7 = (byte)*(undefined4 *)(&DAT_00174170 + (ulong)uVar5 * 4);
  }
  uVar5 = nt * 2;
  lVar6 = (long)nt;
  uVar1 = lVar6 * 3;
  if (nt == 4) {
    auVar13 = pmovzxbw(in_XMM2,*(undefined8 *)(pu1_ref + 4));
    auVar27 = pmovzxbw(in_XMM3,*(undefined8 *)(pu1_ref + (ulong)uVar5 + 1));
    auVar13 = phaddw(auVar13,(undefined1  [16])0x0);
    auVar13 = phaddw(auVar13,in_XMM0);
    auVar13 = phaddw(auVar13,in_XMM0);
    iVar9 = (int)((((uint)pu1_ref[uVar1 & 0xffffffff] + auVar13._0_4_) - (uint)pu1_ref[uVar5]) + 4)
            >> (bVar7 & 0x1f);
    uVar12 = iVar9 * 3 + 2;
    auVar13 = pshuflw(ZEXT416(uVar12),ZEXT416(uVar12),0);
    sVar14 = auVar13._0_2_;
    sVar16 = auVar13._2_2_;
    uVar17 = (ushort)(sVar14 + auVar27._0_2_) >> 2;
    uVar19 = (ushort)(sVar16 + auVar27._2_2_) >> 2;
    uVar20 = (ushort)(sVar14 + auVar27._4_2_) >> 2;
    uVar21 = (ushort)(sVar16 + auVar27._6_2_) >> 2;
    uVar22 = (ushort)(sVar14 + auVar27._8_2_) >> 2;
    uVar23 = (ushort)(sVar16 + auVar27._10_2_) >> 2;
    uVar24 = (ushort)(sVar14 + auVar27._12_2_) >> 2;
    uVar25 = (ushort)(sVar16 + auVar27._14_2_) >> 2;
    uVar18 = CONCAT13((uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21),
                      CONCAT12((uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20),
                               CONCAT11((uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 -
                                        (0xff < uVar19),
                                        (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 -
                                        (0xff < uVar17))));
    *(undefined4 *)pu1_dst = uVar18;
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         CONCAT17((uVar25 != 0) * (uVar25 < 0x100) * (char)uVar25 - (0xff < uVar25),
                  CONCAT16((uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24),
                           CONCAT15((uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 -
                                    (0xff < uVar23),
                                    CONCAT14((uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 -
                                             (0xff < uVar22),uVar18)))) & 0xffffffffffff0000 |
         (ulong)(ushort)iVar9;
    auVar13 = pshufb(auVar13,(undefined1  [16])aUVar3);
    lVar6 = (long)dst_strd;
    pUVar8 = pu1_dst + lVar6;
    *(int *)(pu1_dst + lVar6) = auVar13._0_4_;
    auVar13 = pshufb(auVar13,(undefined1  [16])aUVar3);
    *(int *)(pu1_dst + lVar6 * 2) = auVar13._0_4_;
    *(int *)(pu1_dst + lVar6 * 3) = auVar13._0_4_;
    *pu1_dst = (UWORD8)((uint)pu1_ref[uVar5 - 1] + iVar9 * 2 + (uint)pu1_ref[9] + 2 >> 2);
    lVar10 = 3;
    do {
      *pUVar8 = (UWORD8)(pu1_ref[lVar10 + ((ulong)(uVar5 - 2) - 3)] + uVar12 >> 2);
      pUVar8 = pUVar8 + lVar6;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  else if (nt == 8) {
    auVar13 = psadbw(*(undefined1 (*) [16])(pu1_ref + 8),(undefined1  [16])0x0);
    auVar13 = pshufb(auVar13,(undefined1  [16])IHEVCE_SHUFFLEMASK5);
    auVar27 = phaddw(auVar13,(undefined1  [16])0x0);
    uVar11 = (int)((((uint)pu1_ref[uVar1 & 0xffffffff] + auVar27._0_4_) - (uint)pu1_ref[uVar5]) + 8)
             >> (bVar7 & 0x1f);
    uVar12 = uVar11 * 3 + 2;
    auVar13 = pshuflw(ZEXT416(uVar12),ZEXT416(uVar12),0);
    auVar27 = pmovzxbw(auVar27,*(undefined8 *)(pu1_ref + (ulong)uVar5 + 1));
    sVar14 = auVar13._0_2_;
    sVar16 = auVar13._2_2_;
    uVar17 = (ushort)(auVar27._0_2_ + sVar14) >> 2;
    uVar19 = (ushort)(auVar27._2_2_ + sVar16) >> 2;
    uVar20 = (ushort)(auVar27._4_2_ + sVar14) >> 2;
    uVar21 = (ushort)(auVar27._6_2_ + sVar16) >> 2;
    uVar22 = (ushort)(auVar27._8_2_ + sVar14) >> 2;
    uVar23 = (ushort)(auVar27._10_2_ + sVar16) >> 2;
    uVar24 = (ushort)(auVar27._12_2_ + sVar14) >> 2;
    uVar25 = (ushort)(auVar27._14_2_ + sVar16) >> 2;
    *(ulong *)pu1_dst =
         CONCAT17((uVar25 != 0) * (uVar25 < 0x100) * (char)uVar25 - (0xff < uVar25),
                  CONCAT16((uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24),
                           CONCAT15((uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 -
                                    (0xff < uVar23),
                                    CONCAT14((uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 -
                                             (0xff < uVar22),
                                             CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                      (char)uVar21 - (0xff < uVar21),
                                                      CONCAT12((uVar20 != 0) * (uVar20 < 0x100) *
                                                               (char)uVar20 - (0xff < uVar20),
                                                               CONCAT11((uVar19 != 0) *
                                                                        (uVar19 < 0x100) *
                                                                        (char)uVar19 -
                                                                        (0xff < uVar19),
                                                                        (uVar17 != 0) *
                                                                        (uVar17 < 0x100) *
                                                                        (char)uVar17 -
                                                                        (0xff < uVar17))))))));
    auVar13 = pshufb(ZEXT416(uVar11),(undefined1  [16])0x0);
    lVar6 = (long)dst_strd;
    pUVar8 = pu1_dst + lVar6;
    uVar15 = auVar13._0_8_;
    *(undefined8 *)(pu1_dst + lVar6) = uVar15;
    *(undefined8 *)(pu1_dst + lVar6 * 2) = uVar15;
    *(undefined8 *)(pu1_dst + lVar6 * 3) = uVar15;
    *(undefined8 *)(pu1_dst + lVar6 * 4) = uVar15;
    *(undefined8 *)(pu1_dst + lVar6 * 5) = uVar15;
    *(undefined8 *)(pu1_dst + lVar6 * 6) = uVar15;
    *(undefined8 *)(pu1_dst + lVar6 * 7) = uVar15;
    *pu1_dst = (UWORD8)((uint)pu1_ref[uVar5 - 1] + uVar11 * 2 + (uint)pu1_ref[0x11] + 2 >> 2);
    lVar10 = 7;
    do {
      *pUVar8 = (UWORD8)(pu1_ref[lVar10 + ((ulong)(uVar5 - 2) - 7)] + uVar12 >> 2);
      pUVar8 = pUVar8 + lVar6;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  else if (nt == 0x20) {
    auVar13 = psadbw(*(undefined1 (*) [16])(pu1_ref + 0x20),(undefined1  [16])0x0);
    auVar27 = psadbw(*(undefined1 (*) [16])(pu1_ref + 0x30),(undefined1  [16])0x0);
    auVar35 = psadbw(*(undefined1 (*) [16])(pu1_ref + 0x40),(undefined1  [16])0x0);
    auVar36 = psadbw(*(undefined1 (*) [16])(pu1_ref + 0x50),(undefined1  [16])0x0);
    auVar37._0_2_ = auVar36._0_2_ + auVar35._0_2_ + auVar27._0_2_ + auVar13._0_2_;
    auVar37._2_2_ = auVar36._2_2_ + auVar35._2_2_ + auVar27._2_2_ + auVar13._2_2_;
    auVar37._4_2_ = auVar36._4_2_ + auVar35._4_2_ + auVar27._4_2_ + auVar13._4_2_;
    auVar37._6_2_ = auVar36._6_2_ + auVar35._6_2_ + auVar27._6_2_ + auVar13._6_2_;
    auVar37._8_2_ = auVar36._8_2_ + auVar35._8_2_ + auVar27._8_2_ + auVar13._8_2_;
    auVar37._10_2_ = auVar36._10_2_ + auVar35._10_2_ + auVar27._10_2_ + auVar13._10_2_;
    auVar37._12_2_ = auVar36._12_2_ + auVar35._12_2_ + auVar27._12_2_ + auVar13._12_2_;
    auVar37._14_2_ = auVar36._14_2_ + auVar35._14_2_ + auVar27._14_2_ + auVar13._14_2_;
    auVar27 = pshufb(auVar37,(undefined1  [16])IHEVCE_SHUFFLEMASK5);
    auVar13 = phaddw(auVar27,auVar13);
    auVar13 = pshufb(ZEXT416((uint)((int)((((uint)pu1_ref[uVar1 & 0xffffffff] + auVar13._0_4_) -
                                          (uint)pu1_ref[uVar5]) + 0x20) >> (bVar7 & 0x1f))),
                     (undefined1  [16])0x0);
    bVar4 = true;
    do {
      bVar2 = bVar4;
      *(undefined1 (*) [16])pu1_dst = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 2) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 3) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 4) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 5) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 6) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 7) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 8) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 9) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 10) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 0xb) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 0xc) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 0xd) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 0xe) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 0xf) = auVar13;
      *(undefined1 (*) [16])((long)pu1_dst + 0x10) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 2) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 3) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 4) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 5) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 6) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 7) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 8) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 9) = auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 10) = auVar13
      ;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 0xb) =
           auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 0xc) =
           auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 0xd) =
           auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 0xe) =
           auVar13;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 0xf) =
           auVar13;
      pu1_dst = *(undefined1 (*) [16])pu1_dst + dst_strd * 0x10;
      bVar4 = false;
    } while (bVar2);
  }
  else {
    auVar13 = psadbw(*(undefined1 (*) [16])(pu1_ref + lVar6),(undefined1  [16])0x0);
    auVar27 = psadbw(*(undefined1 (*) [16])(pu1_ref + lVar6 + 0x10),(undefined1  [16])0x0);
    auVar36._0_2_ = auVar27._0_2_ + auVar13._0_2_;
    auVar36._2_2_ = auVar27._2_2_ + auVar13._2_2_;
    auVar36._4_2_ = auVar27._4_2_ + auVar13._4_2_;
    auVar36._6_2_ = auVar27._6_2_ + auVar13._6_2_;
    auVar36._8_2_ = auVar27._8_2_ + auVar13._8_2_;
    auVar36._10_2_ = auVar27._10_2_ + auVar13._10_2_;
    auVar36._12_2_ = auVar27._12_2_ + auVar13._12_2_;
    auVar36._14_2_ = auVar27._14_2_ + auVar13._14_2_;
    auVar27 = pmovzxbw(auVar13,*(undefined8 *)(pu1_ref + (long)(int)uVar5 + 1));
    auVar35 = pmovzxbw(in_XMM3,*(undefined8 *)(pu1_ref + (long)(int)uVar5 + 9));
    auVar13 = pshufb(auVar36,(undefined1  [16])IHEVCE_SHUFFLEMASK5);
    auVar13 = phaddw(auVar13,(undefined1  [16])0x0);
    uVar12 = (int)(((uint)pu1_ref[uVar1] + nt + auVar13._0_4_) - (uint)pu1_ref[(int)uVar5]) >>
             (bVar7 & 0x1f);
    auVar13 = ZEXT416(uVar12 * 3 + 2);
    auVar13 = pshuflw(auVar13,auVar13,0);
    sVar14 = auVar13._0_2_;
    sVar16 = auVar13._2_2_;
    uVar17 = (ushort)(auVar27._0_2_ + sVar14) >> 2;
    uVar19 = (ushort)(auVar27._2_2_ + sVar16) >> 2;
    uVar20 = (ushort)(auVar27._4_2_ + sVar14) >> 2;
    uVar21 = (ushort)(auVar27._6_2_ + sVar16) >> 2;
    uVar22 = (ushort)(auVar27._8_2_ + sVar14) >> 2;
    uVar23 = (ushort)(auVar27._10_2_ + sVar16) >> 2;
    uVar24 = (ushort)(auVar27._12_2_ + sVar14) >> 2;
    uVar25 = (ushort)(auVar27._14_2_ + sVar16) >> 2;
    uVar26 = (ushort)(auVar35._0_2_ + sVar14) >> 2;
    uVar28 = (ushort)(auVar35._2_2_ + sVar16) >> 2;
    uVar29 = (ushort)(auVar35._4_2_ + sVar14) >> 2;
    uVar30 = (ushort)(auVar35._6_2_ + sVar16) >> 2;
    uVar31 = (ushort)(auVar35._8_2_ + sVar14) >> 2;
    uVar32 = (ushort)(auVar35._10_2_ + sVar16) >> 2;
    uVar33 = (ushort)(auVar35._12_2_ + sVar14) >> 2;
    uVar34 = (ushort)(auVar35._14_2_ + sVar16) >> 2;
    *pu1_dst = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17);
    pu1_dst[1] = (uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19);
    pu1_dst[2] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
    pu1_dst[3] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
    pu1_dst[4] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
    pu1_dst[5] = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
    pu1_dst[6] = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
    pu1_dst[7] = (uVar25 != 0) * (uVar25 < 0x100) * (char)uVar25 - (0xff < uVar25);
    pu1_dst[8] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
    pu1_dst[9] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
    pu1_dst[10] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
    pu1_dst[0xb] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
    pu1_dst[0xc] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
    pu1_dst[0xd] = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
    pu1_dst[0xe] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
    pu1_dst[0xf] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
    lVar6 = (long)dst_strd;
    if (1 < nt) {
      auVar13 = pshufb(ZEXT416(uVar12),(undefined1  [16])0x0);
      iVar9 = 1;
      do {
        *(undefined1 (*) [16])(pu1_dst + lVar6) = auVar13;
        *(undefined1 (*) [16])(pu1_dst + lVar6 * 2) = auVar13;
        *(undefined1 (*) [16])(pu1_dst + lVar6 * 3) = auVar13;
        *(undefined1 (*) [16])(pu1_dst + lVar6 * 4) = auVar13;
        *(undefined1 (*) [16])(pu1_dst + lVar6 * 5) = auVar13;
        *(undefined1 (*) [16])(pu1_dst + lVar6 * 6) = auVar13;
        *(undefined1 (*) [16])(pu1_dst + lVar6 * 7) = auVar13;
        *(undefined1 (*) [16])(pu1_dst + lVar6 * 8) = auVar13;
        *(undefined1 (*) [16])(pu1_dst + lVar6 * 9) = auVar13;
        *(undefined1 (*) [16])(pu1_dst + lVar6 * 10) = auVar13;
        *(undefined1 (*) [16])(pu1_dst + lVar6 * 0xb) = auVar13;
        *(undefined1 (*) [16])(pu1_dst + lVar6 * 0xc) = auVar13;
        *(undefined1 (*) [16])(pu1_dst + lVar6 * 0xd) = auVar13;
        *(undefined1 (*) [16])(pu1_dst + lVar6 * 0xe) = auVar13;
        *(undefined1 (*) [16])(pu1_dst + lVar6 * 0xf) = auVar13;
        iVar9 = iVar9 + 8;
      } while (iVar9 < nt);
    }
    *pu1_dst = (UWORD8)((uint)pu1_ref[(long)(int)uVar5 + 1] +
                        uVar12 * 2 + (uint)pu1_ref[(long)(int)uVar5 + -1] + 2 >> 2);
    if (1 < nt) {
      pUVar8 = pu1_dst + lVar6;
      lVar10 = 0;
      do {
        *pUVar8 = (UWORD8)((uint)pu1_ref[lVar10 + (int)(uVar5 - 2)] + uVar12 * 3 + 2 >> 2);
        pUVar8 = pUVar8 + lVar6;
        lVar10 = lVar10 + -1;
      } while (1 - (ulong)(uint)nt != lVar10);
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_dc_ssse3(UWORD8 *pu1_ref,
                                    WORD32 src_strd,
                                    UWORD8 *pu1_dst,
                                    WORD32 dst_strd,
                                    WORD32 nt,
                                    WORD32 mode)
{

    WORD32 acc_dc;
    WORD32 dc_val, two_dc_val, three_dc_val;
    WORD32 row;
    WORD32 log2nt = 5;
    WORD32 two_nt, three_nt;
    __m128i src_temp1, src_temp7, src_temp3, src_temp4, src_temp5, src_temp6;
    __m128i src_temp8, src_temp10, src_temp2;
    __m128i m_zero = _mm_setzero_si128();
    __m128i sm = _mm_load_si128((__m128i *)&IHEVCE_SHUFFLEMASK5[0]);
    UNUSED(src_strd);
    UNUSED(mode);


    switch(nt)
    {
        case 32:
            log2nt = 5;
            break;
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }
    two_nt = 2 * nt;
    three_nt = 3 * nt;

    acc_dc = 0;
    /* Calculate DC value for the transform block */



    if(nt == 32)
    {
        __m128i temp;
        WORD32 itr_count;

        src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));
        src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 16));
        src_temp7 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 32));
        src_temp8 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 48));

        src_temp3 = _mm_sad_epu8(src_temp3, m_zero);
        src_temp4 = _mm_sad_epu8(src_temp4, m_zero);
        src_temp7 = _mm_sad_epu8(src_temp7, m_zero);
        src_temp8 = _mm_sad_epu8(src_temp8, m_zero);

        src_temp4 = _mm_add_epi16(src_temp3, src_temp4);
        src_temp8 = _mm_add_epi16(src_temp7, src_temp8);
        src_temp4 = _mm_add_epi16(src_temp4, src_temp8);

        src_temp4 = _mm_shuffle_epi8(src_temp4, sm);
        src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

        acc_dc = _mm_cvtsi128_si32(src_temp4);

        acc_dc += pu1_ref[three_nt];
        acc_dc -= pu1_ref[two_nt];

        /* computing acc_dc value */
        dc_val = (acc_dc + nt) >> (log2nt + 1);

        two_dc_val = 2 * dc_val;
        three_dc_val = 3 * dc_val;

        temp = _mm_set1_epi8(dc_val);

        for(itr_count = 0; itr_count < 2; itr_count++)
        {
            /*  pu1_dst[(row * dst_strd) + col] = dc_val;*/
            _mm_storeu_si128((__m128i *)(pu1_dst + ((0) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((1) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((2) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((3) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((4) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((5) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((6) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((7) * dst_strd)), temp);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((8) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((9) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((10) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((11) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((12) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((13) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((14) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((15) * dst_strd)), temp);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((0) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((1) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((2) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((3) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((4) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((5) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((6) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((7) * dst_strd)), temp);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((8) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((9) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((10) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((11) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((12) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((13) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((14) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((15) * dst_strd)), temp);

            pu1_dst += 16 * dst_strd;
        }
    }
    else

    {
        __m128i sm1 = _mm_load_si128((__m128i *)&IHEVCE_SHUFFLEMASK4[0]);

        /* DC filtering for the first top row and first left column */



        if(nt == 4) /* nt multiple of 4*/
        {
            WORD32 temp1, temp2, temp3;

            src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));
            src_temp2 =  _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));

            src_temp4 =  _mm_unpacklo_epi8(src_temp3, m_zero);
            src_temp2 =  _mm_unpacklo_epi8(src_temp2, m_zero);

            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

            acc_dc = _mm_cvtsi128_si32(src_temp4);
            acc_dc += pu1_ref[three_nt];
            acc_dc -= pu1_ref[two_nt];

/* computing acc_dc value */

            dc_val = (acc_dc + nt) >> (log2nt + 1);

            three_dc_val = 3 * dc_val;

            /* loding 8-bit 16 pixel */
            src_temp1 = _mm_set1_epi16(three_dc_val + 2);
            two_dc_val = 2 * dc_val;

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2 */
            src_temp2 = _mm_add_epi16(src_temp2, src_temp1);

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2) >> 2 */
            src_temp2 = _mm_srli_epi16(src_temp2, 2);

            src_temp2 = _mm_packus_epi16(src_temp2, m_zero);

            temp1 = _mm_cvtsi128_si32(src_temp2);

            *(WORD32 *)(&pu1_dst[0]) = temp1;

            src_temp2 = _mm_insert_epi16(src_temp2, dc_val, 0);

            src_temp2 =  _mm_shuffle_epi8(src_temp2, sm1);
            src_temp3 =  _mm_shuffle_epi8(src_temp2, sm1);
            src_temp4 =  _mm_shuffle_epi8(src_temp2, sm1);

            temp1 = _mm_cvtsi128_si32(src_temp2);
            temp2 = _mm_cvtsi128_si32(src_temp3);
            temp3 = _mm_cvtsi128_si32(src_temp4);

            *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp2;
            *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp3;

            /*  retore  first value*/
            pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                            >> 2);

            for(row = 1; row < nt; row++)
                pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                                >> 2;

        }
        else if(nt == 8) /* if nt%8==0*/
        {

            src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));

            src_temp4 = _mm_sad_epu8(src_temp3, m_zero);
            src_temp4 = _mm_shuffle_epi8(src_temp4, sm);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

            acc_dc = _mm_cvtsi128_si32(src_temp4);

            acc_dc += pu1_ref[three_nt];
            acc_dc -= pu1_ref[two_nt];

            /* computing acc_dc value */

            dc_val = (acc_dc + nt) >> (log2nt + 1);

            three_dc_val = 3 * dc_val;
            src_temp1 = _mm_set1_epi16(three_dc_val + 2);
            two_dc_val = 2 * dc_val;

            /* loding 8-bit 16 pixel */
            src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp2 =  _mm_unpacklo_epi8(src_temp2, m_zero);

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2 */
            src_temp2 = _mm_add_epi16(src_temp2, src_temp1);

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2)>>2 */
            src_temp2 = _mm_srli_epi16(src_temp2, 2);
            src_temp2 = _mm_packus_epi16(src_temp2, m_zero);

            _mm_storel_epi64((__m128i *)(pu1_dst), src_temp2);

            /* Fill the remaining rows with DC value*/

            src_temp1 = _mm_set1_epi8(dc_val);
            src_temp2 = _mm_set1_epi8(dc_val);
            src_temp3 = _mm_set1_epi8(dc_val);
            src_temp4 = _mm_set1_epi8(dc_val);
            src_temp5 = _mm_set1_epi8(dc_val);
            src_temp6 = _mm_set1_epi8(dc_val);
            src_temp7 = _mm_set1_epi8(dc_val);

            _mm_storel_epi64((__m128i *)(pu1_dst + ((1) * dst_strd)), src_temp1);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((2) * dst_strd)), src_temp2);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((3) * dst_strd)), src_temp3);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((4) * dst_strd)), src_temp4);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((5) * dst_strd)), src_temp5);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((6) * dst_strd)), src_temp6);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((7) * dst_strd)), src_temp7);

            /*  retore  first value*/
            pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                            >> 2);

            for(row = 1; row < nt; row++)
                pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                                >> 2;

        }
        else /* if nt == 16*/
        {

            src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));
            src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 16));

            src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp10 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 8));

            src_temp3 = _mm_sad_epu8(src_temp3, m_zero);
            src_temp4 = _mm_sad_epu8(src_temp4, m_zero);

            src_temp2  =  _mm_unpacklo_epi8(src_temp2, m_zero);
            src_temp10 =  _mm_unpacklo_epi8(src_temp10, m_zero);

            src_temp4 = _mm_add_epi16(src_temp3, src_temp4);
            src_temp4 = _mm_shuffle_epi8(src_temp4, sm);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

            acc_dc = _mm_cvtsi128_si32(src_temp4);

            acc_dc += pu1_ref[three_nt];
            acc_dc -= pu1_ref[two_nt];

            /* computing acc_dc value */

            dc_val = (acc_dc + nt) >> (log2nt + 1);

            three_dc_val = 3 * dc_val;
            src_temp1 = _mm_set1_epi16(three_dc_val + 2);
            two_dc_val = 2 * dc_val;

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2 */
            src_temp2 = _mm_add_epi16(src_temp2, src_temp1);
            src_temp10 = _mm_add_epi16(src_temp10, src_temp1);
            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2)>>2 */
            src_temp2 = _mm_srli_epi16(src_temp2, 2);
            src_temp10 = _mm_srli_epi16(src_temp10, 2);

            src_temp2 = _mm_packus_epi16(src_temp2, src_temp10);

            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp2);

            /* Fill the remaining rows with DC value*/
            src_temp1 =  _mm_set1_epi8(dc_val);
            src_temp2 =  _mm_set1_epi8(dc_val);
            src_temp3 =  _mm_set1_epi8(dc_val);
            src_temp4 =  _mm_set1_epi8(dc_val);
            src_temp5 =  _mm_set1_epi8(dc_val);
            src_temp6 =  _mm_set1_epi8(dc_val);
            src_temp7 =  _mm_set1_epi8(dc_val);

            for(row = 1; row < nt; row += 8)
            {

                _mm_storeu_si128((__m128i *)(pu1_dst + ((1) * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((2) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((3) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((4) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((5) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((6) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((7) * dst_strd)), src_temp7);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((8) * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((9) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((10) * dst_strd)), src_temp3);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((11) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((12) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((13) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((14) * dst_strd)), src_temp7);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((15) * dst_strd)), src_temp1);

            }

            /*  retore  first value*/
            pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                            >> 2);

            for(row = 1; row < nt; row++)
                pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                                >> 2;

        }
    }
}